

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O2

void Omega_h::context_adding_routine
               (vector<int,_std::allocator<int>_> *lane,int zeta_pointer,Context *contexts_generated
               ,Contexts *contexts,bool verbose,GrammarPtr *grammar)

{
  int i;
  ostream *poVar1;
  const_reference pvVar2;
  reference pvVar3;
  char *pcVar4;
  undefined3 in_register_00000081;
  int r;
  
  if (CONCAT31(in_register_00000081,verbose) != 0) {
    std::operator<<((ostream *)&std::cerr,"  CONTEXT ADDING ROUTINE\n");
    std::operator<<((ostream *)&std::cerr,"  LANE:");
    print_stack(lane);
    poVar1 = std::operator<<((ostream *)&std::cerr,"  $\\zeta$-POINTER = ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,zeta_pointer);
    std::operator<<(poVar1,'\n');
  }
  do {
    if ((zeta_pointer < 0) ||
       ((contexts_generated->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      return;
    }
    pvVar2 = at<int>(lane,zeta_pointer);
    i = *pvVar2;
    if (verbose) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"    r = ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,zeta_pointer);
      std::operator<<(poVar1,", $v_r$ = ");
      if (i < 0) {
        pcVar4 = "marker\n";
        if (i != -0x1b1) {
          if (i != -100) goto LAB_00246fbb;
          pcVar4 = "zero\n";
        }
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cerr,"$\\tau_r$ = ");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,i);
        std::operator<<(poVar1,'\n');
        std::operator<<((ostream *)&std::cerr,"    CONTEXTS_GENERATED = ");
        print_set(contexts_generated,
                  (grammar->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
        std::operator<<((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ");
        pvVar3 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
        print_set(pvVar3,(grammar->
                         super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
        std::operator<<((ostream *)&std::cerr,
                        "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - CONTEXTS_$\\tau_r$");
        pvVar3 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
        subtract_from<int>(contexts_generated,pvVar3);
        std::operator<<((ostream *)&std::cerr,"\n    CONTEXTS_GENERATED = ");
        print_set(contexts_generated,
                  (grammar->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
        std::operator<<((ostream *)&std::cerr,
                        "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U CONTEXTS_GENERATED");
LAB_00246f61:
        pvVar3 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
        unite_with<int>(pvVar3,contexts_generated);
        if (!verbose) goto LAB_00246fbb;
        std::operator<<((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ");
        pvVar3 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
        print_set(pvVar3,(grammar->
                         super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
        pcVar4 = "\n";
      }
      std::operator<<((ostream *)&std::cerr,pcVar4);
    }
    else if (-1 < i) {
      pvVar3 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
      subtract_from<int>(contexts_generated,pvVar3);
      goto LAB_00246f61;
    }
LAB_00246fbb:
    zeta_pointer = zeta_pointer + -1;
  } while( true );
}

Assistant:

static void context_adding_routine(std::vector<int> const& lane,
    int zeta_pointer, Context& contexts_generated, Contexts& contexts,
    bool verbose, GrammarPtr grammar) {
  if (verbose) {
    std::cerr << "  CONTEXT ADDING ROUTINE\n";
    std::cerr << "  LANE:";
    print_stack(lane);
    std::cerr << "  $\\zeta$-POINTER = " << zeta_pointer << '\n';
  }
  for (int r = zeta_pointer; r >= 0 && (!contexts_generated.empty()); --r) {
    auto v_r = at(lane, r);
    if (verbose) std::cerr << "    r = " << r << ", $v_r$ = ";
    if (v_r < 0) {
      if (verbose) {
        if (v_r == MARKER)
          std::cerr << "marker\n";
        else if (v_r == ZERO)
          std::cerr << "zero\n";
      }
      continue;
    }
    auto tau_r_addr = v_r;
    if (verbose) {
      std::cerr << "$\\tau_r$ = " << tau_r_addr << '\n';
      std::cerr << "    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - "
                   "CONTEXTS_$\\tau_r$";
    }
    subtract_from(contexts_generated, at(contexts, tau_r_addr));
    if (verbose) {
      std::cerr << "\n    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U "
                   "CONTEXTS_GENERATED";
    }
    unite_with(at(contexts, tau_r_addr), contexts_generated);
    if (verbose) {
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n";
    }
  }
}